

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDefaultVertexAttributeTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::DefaultVertexAttributeTests::init
          (DefaultVertexAttributeTests *this,EVP_PKEY_CTX *ctx)

{
  char cVar1;
  undefined4 uVar2;
  TestContext *pTVar3;
  char *pcVar4;
  Context *pCVar5;
  DataType DVar6;
  undefined8 in_RAX;
  AttributeCase *pAVar7;
  FloatLoader *pFVar8;
  undefined8 extraout_RAX;
  TestNode *pTVar9;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  TestNode *pTVar10;
  long lVar11;
  bool bVar12;
  DataType in_stack_ffffffffffffff60;
  allocator<char> local_91;
  TestNode *local_90;
  long local_88;
  TestNode *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  lVar11 = 0xc;
  local_80 = (TestNode *)this;
  while (lVar11 != 0xdc) {
    local_90 = (TestNode *)operator_new(0x70);
    pTVar3 = local_80->m_testCtx;
    pcVar4 = *(char **)((long)&PTR_iterate_00c244c0 + lVar11 + 4);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"test with ",&local_91);
    std::operator+(&local_78,&local_58,pcVar4);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_90,pTVar3,pcVar4,local_78._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    cVar1 = *(char *)((long)&init::floatTargets[0].name + lVar11);
    pCVar5 = (Context *)local_80[1]._vptr_TestNode;
    local_88 = CONCAT44(local_88._4_4_,*(undefined4 *)(&UNK_00c244cc + lVar11));
    local_38 = lVar11;
    pAVar7 = (AttributeCase *)operator_new(0xb0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Test ",&local_91);
    std::operator+(&local_78,&local_58,"VertexAttrib1f");
    anon_unknown_1::AttributeCase::AttributeCase
              (pAVar7,pCVar5,"vertex_attrib_1f",local_78._M_dataplus._M_p,"VertexAttrib1f",true,
               SUB81(local_88,0),in_stack_ffffffffffffff60);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    pFVar8 = (FloatLoader *)operator_new(8);
    pTVar10 = local_90;
    pFVar8->_vptr_FloatLoader = (_func_int **)&PTR__FloatLoader_00c24698;
    pAVar7->m_loader = pFVar8;
    tcu::TestNode::addChild(local_90,(TestNode *)pAVar7);
    pTVar9 = local_80;
    pCVar5 = (Context *)local_80[1]._vptr_TestNode;
    if (cVar1 == '\0') {
      pAVar7 = (AttributeCase *)operator_new(0xb0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Test ",&local_91);
      std::operator+(&local_78,&local_58,"VertexAttrib2f");
      pTVar9 = local_80;
      anon_unknown_1::AttributeCase::AttributeCase
                (pAVar7,pCVar5,"vertex_attrib_2f",local_78._M_dataplus._M_p,"VertexAttrib2f",true,
                 SUB81(local_88,0),in_stack_ffffffffffffff60);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
      pFVar8 = (FloatLoader *)operator_new(8);
      pFVar8->_vptr_FloatLoader = (_func_int **)&PTR__FloatLoader_00c246e8;
      pAVar7->m_loader = pFVar8;
      tcu::TestNode::addChild(local_90,(TestNode *)pAVar7);
      pCVar5 = (Context *)pTVar9[1]._vptr_TestNode;
      pAVar7 = (AttributeCase *)operator_new(0xb0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Test ",&local_91);
      std::operator+(&local_78,&local_58,"VertexAttrib3f");
      DVar6 = (DataType)local_88;
      anon_unknown_1::AttributeCase::AttributeCase
                (pAVar7,pCVar5,"vertex_attrib_3f",local_78._M_dataplus._M_p,"VertexAttrib3f",true,
                 SUB81(local_88,0),in_stack_ffffffffffffff60);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
      pFVar8 = (FloatLoader *)operator_new(8);
      pTVar10 = local_90;
      pFVar8->_vptr_FloatLoader = (_func_int **)&PTR__FloatLoader_00c24728;
      pAVar7->m_loader = pFVar8;
      tcu::TestNode::addChild(local_90,(TestNode *)pAVar7);
      pAVar7 = anon_unknown_1::AttributeCase::
               create<deqp::gles3::Functional::(anonymous_namespace)::LoaderVertexAttrib4f>
                         ((Context *)pTVar9[1]._vptr_TestNode,DVar6);
      tcu::TestNode::addChild(pTVar10,(TestNode *)pAVar7);
      pAVar7 = anon_unknown_1::AttributeCase::
               create<deqp::gles3::Functional::(anonymous_namespace)::LoaderVertexAttrib1fv>
                         ((Context *)pTVar9[1]._vptr_TestNode,DVar6);
      tcu::TestNode::addChild(pTVar10,(TestNode *)pAVar7);
      pCVar5 = (Context *)pTVar9[1]._vptr_TestNode;
      pAVar7 = (AttributeCase *)operator_new(0xb0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Test ",&local_91);
      std::operator+(&local_78,&local_58,"VertexAttrib2fv");
      anon_unknown_1::AttributeCase::AttributeCase
                (pAVar7,pCVar5,"vertex_attrib_2fv",local_78._M_dataplus._M_p,"VertexAttrib2fv",true,
                 SUB81(local_88,0),in_stack_ffffffffffffff60);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
      pFVar8 = (FloatLoader *)operator_new(8);
      pFVar8->_vptr_FloatLoader = (_func_int **)&PTR__FloatLoader_00c247e8;
      pAVar7->m_loader = pFVar8;
      tcu::TestNode::addChild(local_90,(TestNode *)pAVar7);
      pCVar5 = (Context *)pTVar9[1]._vptr_TestNode;
      pAVar7 = (AttributeCase *)operator_new(0xb0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Test ",&local_91);
      std::operator+(&local_78,&local_58,"VertexAttrib3fv");
      anon_unknown_1::AttributeCase::AttributeCase
                (pAVar7,pCVar5,"vertex_attrib_3fv",local_78._M_dataplus._M_p,"VertexAttrib3fv",true,
                 SUB81(local_88,0),in_stack_ffffffffffffff60);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
      pFVar8 = (FloatLoader *)operator_new(8);
      pFVar8->_vptr_FloatLoader = (_func_int **)&PTR__FloatLoader_00c24828;
      pAVar7->m_loader = pFVar8;
      pTVar10 = local_90;
    }
    else {
      DVar6 = (DataType)local_88;
      pAVar7 = anon_unknown_1::AttributeCase::
               create<deqp::gles3::Functional::(anonymous_namespace)::LoaderVertexAttrib4f>
                         (pCVar5,(DataType)local_88);
      tcu::TestNode::addChild(pTVar10,(TestNode *)pAVar7);
      pAVar7 = anon_unknown_1::AttributeCase::
               create<deqp::gles3::Functional::(anonymous_namespace)::LoaderVertexAttrib1fv>
                         ((Context *)pTVar9[1]._vptr_TestNode,DVar6);
    }
    tcu::TestNode::addChild(pTVar10,(TestNode *)pAVar7);
    pCVar5 = (Context *)pTVar9[1]._vptr_TestNode;
    pAVar7 = (AttributeCase *)operator_new(0xb0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Test ",&local_91);
    std::operator+(&local_78,&local_58,"VertexAttrib4fv");
    anon_unknown_1::AttributeCase::AttributeCase
              (pAVar7,pCVar5,"vertex_attrib_4fv",local_78._M_dataplus._M_p,"VertexAttrib4fv",true,
               SUB81(local_88,0),in_stack_ffffffffffffff60);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    pFVar8 = (FloatLoader *)operator_new(8);
    pTVar10 = local_90;
    pFVar8->_vptr_FloatLoader = (_func_int **)&PTR__FloatLoader_00c24868;
    pAVar7->m_loader = pFVar8;
    tcu::TestNode::addChild(local_90,(TestNode *)pAVar7);
    tcu::TestNode::addChild(local_80,pTVar10);
    in_RAX = extraout_RAX;
    lVar11 = local_38 + 0x10;
  }
  lVar11 = 0;
  pTVar10 = local_80;
  while (lVar11 != 0x40) {
    pTVar9 = (TestNode *)operator_new(0x70);
    pTVar3 = pTVar10->m_testCtx;
    pcVar4 = *(char **)((long)&init::intTargets[0].name + lVar11);
    local_90 = pTVar9;
    local_88 = lVar11;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"test with ",&local_91);
    std::operator+(&local_78,&local_58,pcVar4);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar9,pTVar3,pcVar4,local_78._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    pCVar5 = (Context *)pTVar10[1]._vptr_TestNode;
    uVar2 = *(undefined4 *)((long)&init::intTargets[0].dataType + local_88);
    pAVar7 = (AttributeCase *)operator_new(0xb0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Test ",&local_91);
    std::operator+(&local_78,&local_58,"VertexAttrib4i");
    bVar12 = SUB41(uVar2,0);
    anon_unknown_1::AttributeCase::AttributeCase
              (pAVar7,pCVar5,"vertex_attribi_4i",local_78._M_dataplus._M_p,"VertexAttrib4i",true,
               bVar12,in_stack_ffffffffffffff60);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    pFVar8 = (FloatLoader *)operator_new(8);
    pFVar8->_vptr_FloatLoader = (_func_int **)&PTR__FloatLoader_00c248a8;
    pAVar7->m_loader = pFVar8;
    tcu::TestNode::addChild(local_90,(TestNode *)pAVar7);
    pCVar5 = (Context *)local_80[1]._vptr_TestNode;
    pAVar7 = (AttributeCase *)operator_new(0xb0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Test ",&local_91);
    std::operator+(&local_78,&local_58,"VertexAttrib4iv");
    anon_unknown_1::AttributeCase::AttributeCase
              (pAVar7,pCVar5,"vertex_attribi_4iv",local_78._M_dataplus._M_p,"VertexAttrib4iv",true,
               bVar12,in_stack_ffffffffffffff60);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    pFVar8 = (FloatLoader *)operator_new(8);
    pTVar9 = local_90;
    pFVar8->_vptr_FloatLoader = (_func_int **)&PTR__FloatLoader_00c248e8;
    pAVar7->m_loader = pFVar8;
    tcu::TestNode::addChild(local_90,(TestNode *)pAVar7);
    pTVar10 = local_80;
    tcu::TestNode::addChild(local_80,pTVar9);
    in_RAX = extraout_RAX_00;
    lVar11 = local_88 + 0x10;
  }
  lVar11 = 0;
  while (lVar11 != 0x40) {
    pTVar9 = (TestNode *)operator_new(0x70);
    pTVar3 = pTVar10->m_testCtx;
    pcVar4 = *(char **)((long)&init::uintTargets[0].name + lVar11);
    local_90 = pTVar9;
    local_88 = lVar11;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"test with ",&local_91);
    std::operator+(&local_78,&local_58,pcVar4);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar9,pTVar3,pcVar4,local_78._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    pCVar5 = (Context *)pTVar10[1]._vptr_TestNode;
    uVar2 = *(undefined4 *)((long)&init::uintTargets[0].dataType + local_88);
    pAVar7 = (AttributeCase *)operator_new(0xb0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Test ",&local_91);
    std::operator+(&local_78,&local_58,"VertexAttrib4ui");
    bVar12 = SUB41(uVar2,0);
    anon_unknown_1::AttributeCase::AttributeCase
              (pAVar7,pCVar5,"vertex_attribi_4ui",local_78._M_dataplus._M_p,"VertexAttrib4ui",false,
               bVar12,in_stack_ffffffffffffff60);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    pFVar8 = (FloatLoader *)operator_new(8);
    pFVar8->_vptr_FloatLoader = (_func_int **)&PTR__FloatLoader_00c24928;
    pAVar7->m_loader = pFVar8;
    tcu::TestNode::addChild(local_90,(TestNode *)pAVar7);
    pCVar5 = (Context *)local_80[1]._vptr_TestNode;
    pAVar7 = (AttributeCase *)operator_new(0xb0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"Test ",&local_91);
    std::operator+(&local_78,&local_58,"VertexAttrib4uiv");
    anon_unknown_1::AttributeCase::AttributeCase
              (pAVar7,pCVar5,"vertex_attribi_4uiv",local_78._M_dataplus._M_p,"VertexAttrib4uiv",
               false,bVar12,in_stack_ffffffffffffff60);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    pFVar8 = (FloatLoader *)operator_new(8);
    pTVar9 = local_90;
    pFVar8->_vptr_FloatLoader = (_func_int **)&PTR__FloatLoader_00c24968;
    pAVar7->m_loader = pFVar8;
    tcu::TestNode::addChild(local_90,(TestNode *)pAVar7);
    pTVar10 = local_80;
    tcu::TestNode::addChild(local_80,pTVar9);
    in_RAX = extraout_RAX_01;
    lVar11 = local_88 + 0x10;
  }
  return (int)in_RAX;
}

Assistant:

void DefaultVertexAttributeTests::init (void)
{
	struct Target
	{
		const char*		name;
		glu::DataType	dataType;
		bool			reducedTestSets;	// !< use reduced coverage
	};

	static const Target floatTargets[] =
	{
		{ "float",	glu::TYPE_FLOAT,		false	},
		{ "vec2",	glu::TYPE_FLOAT_VEC2,	true	},
		{ "vec3",	glu::TYPE_FLOAT_VEC3,	true	},
		{ "vec4",	glu::TYPE_FLOAT_VEC4,	false	},
		{ "mat2",	glu::TYPE_FLOAT_MAT2,	true	},
		{ "mat2x3",	glu::TYPE_FLOAT_MAT2X3,	true	},
		{ "mat2x4",	glu::TYPE_FLOAT_MAT2X4,	true	},
		{ "mat3",	glu::TYPE_FLOAT_MAT3,	true	},
		{ "mat3x2",	glu::TYPE_FLOAT_MAT3X2,	true	},
		{ "mat3x4",	glu::TYPE_FLOAT_MAT3X4,	true	},
		{ "mat4",	glu::TYPE_FLOAT_MAT4,	false	},
		{ "mat4x2",	glu::TYPE_FLOAT_MAT4X2,	true	},
		{ "mat4x3",	glu::TYPE_FLOAT_MAT4X3,	true	},
	};

	static const Target intTargets[] =
	{
		{ "int",	glu::TYPE_INT,			false	},
		{ "ivec2",	glu::TYPE_INT_VEC2,		true	},
		{ "ivec3",	glu::TYPE_INT_VEC3,		true	},
		{ "ivec4",	glu::TYPE_INT_VEC4,		false	},
	};

	static const Target uintTargets[] =
	{
		{ "uint",	glu::TYPE_UINT,			false	},
		{ "uvec2",	glu::TYPE_UINT_VEC2,	true	},
		{ "uvec3",	glu::TYPE_UINT_VEC3,	true	},
		{ "uvec4",	glu::TYPE_UINT_VEC4,	false	},
	};

	// float targets

	for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(floatTargets); ++targetNdx)
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, floatTargets[targetNdx].name, (std::string("test with ") + floatTargets[targetNdx].name).c_str());
		const bool					fullSet	= !floatTargets[targetNdx].reducedTestSets;

#define ADD_CASE(X) group->addChild(AttributeCase::create<X>(m_context, floatTargets[targetNdx].dataType))
#define ADD_REDUCED_CASE(X)	if (fullSet) ADD_CASE(X)

		ADD_CASE		(LoaderVertexAttrib1f);
		ADD_REDUCED_CASE(LoaderVertexAttrib2f);
		ADD_REDUCED_CASE(LoaderVertexAttrib3f);
		ADD_CASE		(LoaderVertexAttrib4f);

		ADD_CASE		(LoaderVertexAttrib1fv);
		ADD_REDUCED_CASE(LoaderVertexAttrib2fv);
		ADD_REDUCED_CASE(LoaderVertexAttrib3fv);
		ADD_CASE		(LoaderVertexAttrib4fv);

#undef ADD_CASE
#undef ADD_REDUCED_CASE

		addChild(group);
	}

	// int targets

	for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(intTargets); ++targetNdx)
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, intTargets[targetNdx].name, (std::string("test with ") + intTargets[targetNdx].name).c_str());

#define ADD_CASE(X) group->addChild(AttributeCase::create<X>(m_context, intTargets[targetNdx].dataType))

		ADD_CASE		(LoaderVertexAttribI4i);
		ADD_CASE		(LoaderVertexAttribI4iv);

#undef ADD_CASE

		addChild(group);
	}

	// uint targets

	for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(uintTargets); ++targetNdx)
	{
		tcu::TestCaseGroup* const	group	= new tcu::TestCaseGroup(m_testCtx, uintTargets[targetNdx].name, (std::string("test with ") + uintTargets[targetNdx].name).c_str());

#define ADD_CASE(X) group->addChild(AttributeCase::create<X>(m_context, uintTargets[targetNdx].dataType))

		ADD_CASE		(LoaderVertexAttribI4ui);
		ADD_CASE		(LoaderVertexAttribI4uiv);

#undef ADD_CASE

		addChild(group);
	}
}